

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O2

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
           *this)

{
  tuple<unsigned_long,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_> *alloc;
  ulong capacity;
  size_t pos;
  size_t sVar1;
  size_t sVar2;
  byte bVar3;
  size_t new_capacity;
  FindInfo FVar4;
  size_t hashval;
  anon_class_16_2_f7bee600 probe_index;
  type raw;
  
  capacity = this->capacity_;
  if ((capacity == 0) || ((capacity + 1 & capacity) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x822,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>, phmap::Hash<Person>, phmap::EqualTo<Person>, std::allocator<Person>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<Person>, Hash = phmap::Hash<Person>, Eq = phmap::EqualTo<Person>, Alloc = std::allocator<Person>]"
                 );
  }
  if (capacity < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x823,
                  "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>, phmap::Hash<Person>, phmap::EqualTo<Person>, std::allocator<Person>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<Person>, Hash = phmap::Hash<Person>, Eq = phmap::EqualTo<Person>, Alloc = std::allocator<Person>]"
                 );
  }
  ConvertDeletedToEmptyAndFullToDeleted(this->ctrl_,capacity);
  alloc = &this->settings_;
  new_capacity = 0;
  do {
    if (new_capacity == this->capacity_) {
      reset_growth_left(this,new_capacity);
      return;
    }
    if (this->ctrl_[new_capacity] == -2) {
      probe_index.this =
           (raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,_phmap::Hash<Person>,_phmap::EqualTo<Person>,_std::allocator<Person>_>
            *)alloc;
      hashval = DecomposeValue<phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>,phmap::Hash<Person>,phmap::EqualTo<Person>,std::allocator<Person>>::HashElement,Person&>
                          ((HashElement *)&probe_index,this->slots_ + new_capacity);
      FVar4 = find_first_non_full(this,hashval);
      pos = FVar4.offset;
      probe_index.hashval = &hashval;
      probe_index.this = this;
      sVar1 = drop_deletes_without_resize::anon_class_16_2_f7bee600::operator()(&probe_index,pos);
      sVar2 = drop_deletes_without_resize::anon_class_16_2_f7bee600::operator()
                        (&probe_index,new_capacity);
      bVar3 = (byte)hashval;
      if (sVar1 == sVar2) {
        bVar3 = bVar3 & 0x7f;
      }
      else {
        if (this->ctrl_[pos] == -2) {
          set_ctrl(this,pos,bVar3 & 0x7f);
          FlatHashSetPolicy<Person>::transfer<std::allocator<Person>>
                    ((allocator<Person> *)alloc,(slot_type *)&raw,this->slots_ + new_capacity);
          FlatHashSetPolicy<Person>::transfer<std::allocator<Person>>
                    ((allocator<Person> *)alloc,this->slots_ + new_capacity,this->slots_ + pos);
          FlatHashSetPolicy<Person>::transfer<std::allocator<Person>>
                    ((allocator<Person> *)alloc,this->slots_ + pos,(slot_type *)&raw);
          new_capacity = new_capacity - 1;
          goto LAB_00102167;
        }
        if (this->ctrl_[pos] != -0x80) {
          __assert_fail("IsDeleted(ctrl_[new_i])",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                        ,0x853,
                        "void phmap::priv::raw_hash_set<phmap::priv::FlatHashSetPolicy<Person>, phmap::Hash<Person>, phmap::EqualTo<Person>, std::allocator<Person>>::drop_deletes_without_resize() [Policy = phmap::priv::FlatHashSetPolicy<Person>, Hash = phmap::Hash<Person>, Eq = phmap::EqualTo<Person>, Alloc = std::allocator<Person>]"
                       );
        }
        set_ctrl(this,pos,bVar3 & 0x7f);
        FlatHashSetPolicy<Person>::transfer<std::allocator<Person>>
                  ((allocator<Person> *)alloc,this->slots_ + pos,this->slots_ + new_capacity);
        bVar3 = 0x80;
      }
      set_ctrl(this,new_capacity,bVar3);
    }
LAB_00102167:
    new_capacity = new_capacity + 1;
  } while( true );
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
        assert(IsValidCapacity(capacity_));
        assert(!is_small());
        // Algorithm:
        // - mark all DELETED slots as EMPTY
        // - mark all FULL slots as DELETED
        // - for each slot marked as DELETED
        //     hash = Hash(element)
        //     target = find_first_non_full(hash)
        //     if target is in the same group
        //       mark slot as FULL
        //     else if target is EMPTY
        //       transfer element to target
        //       mark slot as EMPTY
        //       mark target as FULL
        //     else if target is DELETED
        //       swap current element with target element
        //       mark target as FULL
        //       repeat procedure for current slot with moved from element (target)
        ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
        typename phmap::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
            raw;
        slot_type* slot = reinterpret_cast<slot_type*>(&raw);
        for (size_t i = 0; i != capacity_; ++i) {
            if (!IsDeleted(ctrl_[i])) continue;
            size_t hashval = PolicyTraits::apply(HashElement{hash_ref()},
                                                 PolicyTraits::element(slots_ + i));
            auto target = find_first_non_full(hashval);
            size_t new_i = target.offset;

            // Verify if the old and new i fall within the same group wrt the hashval.
            // If they do, we don't need to move the object as it falls already in the
            // best probe we can.
            const auto probe_index = [&](size_t pos) {
                return ((pos - probe(hashval).offset()) & capacity_) / Group::kWidth;
            };

            // Element doesn't move.
            if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
                set_ctrl(i, H2(hashval));
                continue;
            }
            if (IsEmpty(ctrl_[new_i])) {
                // Transfer element to the empty spot.
                // set_ctrl poisons/unpoisons the slots so we have to call it at the
                // right time.
                set_ctrl(new_i, H2(hashval));
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
                set_ctrl(i, kEmpty);
            } else {
                assert(IsDeleted(ctrl_[new_i]));
                set_ctrl(new_i, H2(hashval));
                // Until we are done rehashing, DELETED marks previously FULL slots.
                // Swap i and new_i elements.
                PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
                --i;  // repeat
            }
        }
        reset_growth_left(capacity_);
    }